

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O3

void __thiscall CTcGenTarg::write_funcdep_to_object_file(CTcGenTarg *this,CVmFile *fp)

{
  uint16_t tmp;
  size_t buflen;
  uint16_t tmp_1;
  tc_fnset_entry *ptVar1;
  char b [2];
  undefined2 local_2c;
  undefined2 local_2a;
  
  local_2a = (undefined2)this->fnset_cnt_;
  CVmFile::write_bytes(fp,(char *)&local_2a,2);
  ptVar1 = this->fnset_head_;
  if (ptVar1 != (tc_fnset_entry *)0x0) {
    do {
      buflen = strlen(ptVar1->nm);
      local_2c = (undefined2)buflen;
      CVmFile::write_bytes(fp,(char *)&local_2c,2);
      CVmFile::write_bytes(fp,ptVar1->nm,buflen);
      ptVar1 = ptVar1->nxt;
    } while (ptVar1 != (tc_fnset_entry *)0x0);
  }
  return;
}

Assistant:

void CTcGenTarg::write_funcdep_to_object_file(CVmFile *fp)
{
    tc_fnset_entry *cur;

    /* write the count */
    fp->write_uint2(fnset_cnt_);

    /* write the entries */
    for (cur = fnset_head_ ; cur != 0 ; cur = cur->nxt)
    {
        size_t len;

        len = strlen(cur->nm);
        fp->write_uint2(len);
        fp->write_bytes(cur->nm, len);
    }
}